

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O0

void __thiscall cppcms::impl::string_pool::string_pool(string_pool *this,size_t page_size)

{
  string_pool *in_RSI;
  noncopyable *in_RDI;
  
  booster::noncopyable::noncopyable(in_RDI);
  *(string_pool **)in_RDI = in_RSI;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  add_page(in_RSI);
  return;
}

Assistant:

string_pool(size_t page_size = 2048) : 
				page_size_(page_size),
				pages_(0),
				free_space_(0),
				data_(0)
			{
				add_page();
			}